

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_formatting.c
# Opt level: O0

char * double_all_percent_signs_in(char *original)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RDI;
  char *unaff_retaddr;
  char *new_string;
  size_t percent_count;
  char *in_stack_ffffffffffffffe0;
  char *in_stack_fffffffffffffff8;
  
  sVar1 = count_percent_signs(in_stack_ffffffffffffffe0);
  sVar2 = strlen(in_RDI);
  pcVar3 = (char *)malloc(sVar2 + sVar1 + 1);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    copy_while_doubling_percent_signs(unaff_retaddr,in_stack_fffffffffffffff8);
  }
  return pcVar3;
}

Assistant:

static char *double_all_percent_signs_in(const char *original)
{
    size_t percent_count = count_percent_signs(original);
    char *new_string = (char *)malloc(strlen(original) + percent_count + 1);
    if (new_string == NULL) {
        return NULL;
    }
    copy_while_doubling_percent_signs(new_string, original);
    return new_string;
}